

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

bool __thiscall TPZFMatrix<double>::Compare(TPZFMatrix<double> *this,TPZSavable *copy,bool override)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  stringstream sout;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (copy != (TPZSavable *)0x0) {
    lVar3 = __dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
    if (lVar3 == 0) {
      return false;
    }
    bVar2 = TPZMatrix<double>::Compare(&this->super_TPZMatrix<double>,copy,false);
    lVar5 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (lVar5 < 1) {
      dVar7 = 0.0;
    }
    else {
      dVar7 = 0.0;
      lVar6 = 0;
      do {
        dVar1 = *(double *)(*(long *)(lVar3 + 0x20) + lVar6 * 8);
        bVar2 = (bool)(bVar2 & this->fElem[lVar6] == dVar1);
        dVar7 = dVar7 + ABS(this->fElem[lVar6] - dVar1);
        lVar6 = lVar6 + 1;
      } while (lVar5 - lVar6 != 0);
    }
    if (bVar2 != false) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "virtual bool TPZFMatrix<double>::Compare(TPZSavable *, bool) const [TVar = double]",
               0x52);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," did not compare ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," number different terms ",0x18);
    poVar4 = std::ostream::_M_insert<long>((long)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," number terms ",0xe);
    std::ostream::_M_insert<long>((long)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," difference in norm L1 ",0x17);
    std::ostream::_M_insert<double>(dVar7);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1d8,local_1d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if (override) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.cpp"
                 ,0x903);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        DebugStop();
    }
    return matresult;
}